

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  FilePath local_d8;
  int local_b4;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_b4 = number;
  if (number == 0) {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
    paVar1 = &local_d8.pathname_.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d8.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_d8.pathname_.field_2._8_8_ = plVar4[3];
      local_d8.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_d8.pathname_._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d8.pathname_._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.pathname_._M_dataplus._M_p,
                      local_d8.pathname_.field_2._M_allocated_capacity + 1);
    }
    local_a0[0] = local_e8;
    puVar8 = local_f8;
    if (local_f8 == &local_e8) goto LAB_0014527f;
  }
  else {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    StreamableToString<int>(&local_70,&local_b4);
    uVar6 = 0xf;
    if (local_b0 != local_a0) {
      uVar6 = local_a0[0];
    }
    if (uVar6 < local_70._M_string_length + local_a8) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar7 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_70._M_string_length + local_a8) goto LAB_00145027;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_00145027:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    }
    local_90 = &local_80;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_80 = *plVar4;
      uStack_78 = puVar3[3];
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*puVar3;
    }
    local_88 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_e8 = *puVar8;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar8;
      local_f8 = (ulong *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
    paVar1 = &local_d8.pathname_.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d8.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_d8.pathname_.field_2._8_8_ = plVar4[3];
      local_d8.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_d8.pathname_._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d8.pathname_._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.pathname_._M_dataplus._M_p,
                      local_d8.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    puVar8 = local_b0;
    if (local_b0 == local_a0) goto LAB_0014527f;
  }
  operator_delete(puVar8,local_a0[0] + 1);
LAB_0014527f:
  FilePath(&local_d8,&local_50);
  ConcatPaths(__return_storage_ptr__,directory,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.pathname_._M_dataplus._M_p != &local_d8.pathname_.field_2) {
    operator_delete(local_d8.pathname_._M_dataplus._M_p,
                    local_d8.pathname_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}